

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void add_to_dam(artifact *art,wchar_t fixed,wchar_t random)

{
  uint32_t uVar1;
  wchar_t random_local;
  wchar_t fixed_local;
  artifact *art_local;
  
  if (art->to_d < 0x1b) {
    if ((0x10 < art->to_h) && (uVar1 = Rand_div(2), uVar1 != 0)) {
      file_putf(log_file,"Failed to add to-dam, value %d is too high\n",(ulong)(uint)art->to_d);
      return;
    }
  }
  else {
    uVar1 = Rand_div(6);
    if (uVar1 != 0) {
      file_putf(log_file,"Failed to add to-dam, value %d is too high\n",(ulong)(uint)art->to_d);
      return;
    }
  }
  uVar1 = Rand_div(random);
  art->to_d = (int)(short)((short)fixed + (short)uVar1) + art->to_d;
  file_putf(log_file,"Adding ability: extra to_dam (now %+d)\n",(ulong)(uint)art->to_d);
  return;
}

Assistant:

static void add_to_dam(struct artifact *art, int fixed, int random)
{
	/* Inhibit above certain threshholds */
	if (art->to_d > VERYHIGH_TO_DAM) {
		if (!INHIBIT_STRONG) {
			file_putf(log_file, "Failed to add to-dam, value %d is too high\n",
					  art->to_d);
			return;
		}
	} else if (art->to_h > HIGH_TO_DAM) {
		if (!INHIBIT_WEAK) {
			file_putf(log_file, "Failed to add to-dam, value %d is too high\n",
					  art->to_d);
			return;
		}
	}
	art->to_d += (int16_t)(fixed + randint0(random));
	file_putf(log_file, "Adding ability: extra to_dam (now %+d)\n",
			  art->to_d);
}